

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_aead__build_iv(ptls_aead_algorithm_t *algo,uint8_t *iv,uint8_t *static_iv,uint64_t seq)

{
  uint8_t *d;
  uint8_t *s;
  size_t i;
  size_t iv_size;
  uint64_t seq_local;
  uint8_t *static_iv_local;
  uint8_t *iv_local;
  ptls_aead_algorithm_t *algo_local;
  
  d = iv;
  s = static_iv;
  for (i = algo->iv_size - 8; i != 0; i = i - 1) {
    *d = *s;
    d = d + 1;
    s = s + 1;
  }
  i = 0x40;
  do {
    i = i - 8;
    *d = *s ^ (byte)(seq >> ((byte)i & 0x3f));
    d = d + 1;
    s = s + 1;
  } while (i != 0);
  return;
}

Assistant:

void ptls_aead__build_iv(ptls_aead_algorithm_t *algo, uint8_t *iv, const uint8_t *static_iv, uint64_t seq)
{
    size_t iv_size = algo->iv_size, i;
    const uint8_t *s = static_iv;
    uint8_t *d = iv;

    /* build iv */
    for (i = iv_size - 8; i != 0; --i)
        *d++ = *s++;
    i = 64;
    do {
        i -= 8;
        *d++ = *s++ ^ (uint8_t)(seq >> i);
    } while (i != 0);
}